

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265e_stream_amend.c
# Opt level: O3

MPP_RET hal_h265e_amend_temporal_id(HalEncTask *enc_task,RK_U32 strm_size)

{
  int iVar1;
  void *pvVar2;
  MPP_RET MVar3;
  size_t sVar4;
  void *pvVar5;
  
  pvVar2 = (enc_task->syntax).data;
  sVar4 = mpp_packet_get_length(enc_task->packet);
  pvVar5 = mpp_buffer_get_ptr_with_caller(enc_task->output,"hal_h265e_amend_temporal_id");
  if (strm_size < 5) {
    _mpp_log_l(2,(char *)0x0,"Stream size is too small, maybe there is hw encoder error!",
               (char *)0x0);
    MVar3 = MPP_NOK;
  }
  else {
    iVar1 = *(int *)((long)pvVar2 + 0x124);
    MVar3 = MPP_OK;
    if (iVar1 != 0) {
      *(byte *)((long)pvVar5 + (sVar4 & 0xffffffff) + 5) =
           (char)iVar1 + 1U & 7 | *(byte *)((long)pvVar5 + (sVar4 & 0xffffffff) + 5) & 0xf8;
      MVar3 = MPP_OK;
    }
  }
  return MVar3;
}

Assistant:

MPP_RET hal_h265e_amend_temporal_id(HalEncTask *enc_task, RK_U32 strm_size)
{
    MPP_RET ret = MPP_OK;
    H265eSyntax_new *syn = (H265eSyntax_new *)enc_task->syntax.data;
    RK_U32 offset = mpp_packet_get_length(enc_task->packet);
    RK_U8 *stream_ptr = (RK_U8 *)(mpp_buffer_get_ptr(enc_task->output) + offset);

    if (strm_size < 5) {
        mpp_err("Stream size is too small, maybe there is hw encoder error!");
        return MPP_NOK;
    }

    if (syn->sp.temporal_id)
        stream_ptr[5] = (stream_ptr[5] & 0xf8) | ((syn->sp.temporal_id + 1) & 0x7);

    return ret;
}